

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall
QIconModeViewBase::dataChanged
          (QIconModeViewBase *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  QListView *pQVar5;
  QListViewPrivate *pQVar6;
  QSize QVar7;
  pointer pQVar8;
  Representation RVar9;
  P _a;
  long lVar10;
  ulong uVar11;
  P _b;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  QModelIndex local_120;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = ((this->super_QCommonListViewBase).dd)->column;
  if ((topLeft->c <= iVar1) && (iVar1 <= bottomRight->c)) {
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    pQVar5 = (this->super_QCommonListViewBase).qq;
    (**(code **)(*(long *)&(pQVar5->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(pQVar5,&local_108);
    pQVar6 = (this->super_QCommonListViewBase).dd;
    lVar10 = (this->items).d.size;
    lVar12 = (long)bottomRight->r + 1;
    if (lVar10 < lVar12) {
      lVar12 = lVar10;
    }
    uVar2 = (pQVar6->grid).ht.m_i;
    uVar3 = (pQVar6->grid).wd.m_i;
    lVar10 = (long)topLeft->r;
    lVar13 = lVar10 * 0x14 + 10;
    for (; lVar10 < lVar12; lVar10 = lVar10 + 1) {
      QCommonListViewBase::modelIndex(&local_120,&this->super_QCommonListViewBase,(int)lVar10);
      QVar7 = QCommonListViewBase::itemSize(&this->super_QCommonListViewBase,&local_108,&local_120);
      uVar11 = (ulong)QVar7 >> 0x20;
      if (-1 < (int)(uVar2 | uVar3)) {
        pQVar6 = (this->super_QCommonListViewBase).dd;
        RVar9.m_i = (pQVar6->grid).wd.m_i;
        uVar4 = (pQVar6->grid).ht.m_i;
        if (QVar7.wd.m_i.m_i <= RVar9.m_i) {
          RVar9.m_i = QVar7.wd.m_i.m_i;
        }
        if ((int)uVar4 < QVar7.ht.m_i.m_i) {
          uVar11 = (ulong)uVar4;
        }
        QVar7.ht.m_i = 0;
        QVar7.wd.m_i = RVar9.m_i;
      }
      pQVar8 = QList<QListViewItem>::data(&this->items);
      if (0x7ffe < QVar7.wd.m_i.m_i) {
        QVar7.wd.m_i = 0x7fff;
        QVar7.ht.m_i = 0;
      }
      *(short *)((long)pQVar8 + lVar13 + -2) = (short)QVar7.wd.m_i;
      if (0x7ffe < (int)uVar11) {
        uVar11 = 0x7fff;
      }
      *(short *)((long)&pQVar8->x + lVar13) = (short)uVar11;
      lVar13 = lVar13 + 0x14;
    }
    QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    if (column() >= topLeft.column() && column() <= bottomRight.column())  {
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        const int bottom = qMin(items.size(), bottomRight.row() + 1);
        const bool useItemSize = !dd->grid.isValid();
        for (int row = topLeft.row(); row < bottom; ++row)
        {
            QSize s = itemSize(option, modelIndex(row));
            if (!useItemSize)
            {
                s.setWidth(qMin(dd->grid.width(), s.width()));
                s.setHeight(qMin(dd->grid.height(), s.height()));
            }
            items[row].resize(s);
        }
    }
}